

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void pbrt::PiecewiseConstant1D::TestCompareDistributions
               (PiecewiseConstant1D *da,PiecewiseConstant1D *db,Float eps)

{
  char *pcVar1;
  size_t i;
  ulong uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  Float err;
  Float eps_local;
  
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(da->func).nStored
  ;
  local_58.data_ = (AssertHelperData *)(db->func).nStored;
  eps_local = eps;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"da.func.size()","db.func.size()",(unsigned_long *)&local_60,
             (unsigned_long *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
               ,0x218,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_60.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (da->cdf).nStored;
    local_58.data_ = (AssertHelperData *)(db->cdf).nStored;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"da.cdf.size()","db.cdf.size()",(unsigned_long *)&local_60,
               (unsigned_long *)&local_58);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
                 ,0x219,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&gtest_ar,"da.min","db.min",&da->min,&db->min);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_60);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
                   ,0x21a,pcVar1);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar,"da.max","db.max",&da->max,&db->max);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          for (uVar2 = 0; uVar2 < (da->func).nStored; uVar2 = uVar2 + 1) {
            fVar5 = (da->func).ptr[uVar2] / da->funcInt;
            fVar4 = (db->func).ptr[uVar2] / db->funcInt;
            auVar3._8_4_ = 0x7fffffff;
            auVar3._0_8_ = 0x7fffffff7fffffff;
            auVar3._12_4_ = 0x7fffffff;
            auVar3 = vandps_avx512vl(ZEXT416((uint)(fVar5 - fVar4)),auVar3);
            err = auVar3._0_4_ / ((fVar5 + fVar4) * 0.5);
            testing::internal::CmpHelperLT<float,float>
                      ((internal *)&gtest_ar,"err","eps",&err,&eps_local);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_60);
              std::ostream::operator<<(local_60.ptr_ + 0x10,fVar5);
              std::operator<<((ostream *)(local_60.ptr_ + 0x10)," - ");
              std::ostream::operator<<(local_60.ptr_ + 0x10,fVar4);
              pcVar1 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
                         ,0x21f,pcVar1);
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
              testing::internal::AssertHelper::~AssertHelper(&local_58);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&local_60);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
          }
          return;
        }
        testing::Message::Message((Message *)&local_60);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
                   ,0x21b,pcVar1);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void PiecewiseConstant1D::TestCompareDistributions(const PiecewiseConstant1D &da,
                                                   const PiecewiseConstant1D &db,
                                                   Float eps) {
    ASSERT_EQ(da.func.size(), db.func.size());
    ASSERT_EQ(da.cdf.size(), db.cdf.size());
    ASSERT_EQ(da.min, db.min);
    ASSERT_EQ(da.max, db.max);
    for (size_t i = 0; i < da.func.size(); ++i) {
        Float pdfa = da.func[i] / da.funcInt, pdfb = db.func[i] / db.funcInt;
        Float err = std::abs(pdfa - pdfb) / ((pdfa + pdfb) / 2);
        EXPECT_LT(err, eps) << pdfa << " - " << pdfb;
    }
}